

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

void __thiscall
spvtools::opt::analysis::ConstantManager::RemoveId(ConstantManager *this,uint32_t id)

{
  iterator __it;
  pair<std::_Rb_tree_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::_Rb_tree_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
  pVar1;
  uint32_t local_1c;
  
  local_1c = id;
  __it = std::
         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->id_to_const_val_)._M_h,&local_1c);
  if (__it.
      super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
      ._M_cur != (__node_type *)0x0) {
    pVar1 = std::
            _Rb_tree<const_spvtools::opt::analysis::Constant_*,_std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>,_std::_Select1st<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::less<const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
            ::equal_range(&(this->const_val_to_id_)._M_t,
                          (key_type *)
                          ((long)__it.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                                 ._M_cur + 0x10));
    std::
    _Rb_tree<const_spvtools::opt::analysis::Constant_*,_std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>,_std::_Select1st<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::less<const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
    ::_M_erase_aux(&(this->const_val_to_id_)._M_t,(_Base_ptr)pVar1.first._M_node,
                   (_Base_ptr)pVar1.second._M_node);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->id_to_const_val_)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
            ._M_cur);
  }
  return;
}

Assistant:

void RemoveId(uint32_t id) {
    auto it = id_to_const_val_.find(id);
    if (it != id_to_const_val_.end()) {
      const_val_to_id_.erase(it->second);
      id_to_const_val_.erase(it);
    }
  }